

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  pointer __last;
  pointer __last_00;
  ostream *poVar1;
  size_type __n;
  pointer __result;
  thread *ptVar2;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  anon_class_16_2_be660dc5_for__M_head_impl *extraout_RDX;
  anon_class_16_2_be660dc5_for__M_head_impl *__args;
  anon_class_16_2_be660dc5_for__M_head_impl *__args_00;
  anon_class_16_2_be660dc5_for__M_head_impl *extraout_RDX_00;
  thread *t;
  long lVar4;
  pointer ptVar5;
  vector<std::thread,_std::allocator<std::thread>_> *__range1;
  int iVar6;
  bool bVar7;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  vector<std::thread,_std::allocator<std::thread>_> th;
  shared_ptr<m2d::savanna::ssl_reuse::reuse_async_url_session> async_session;
  shared_ptr<get_yahoo_endpoint> endpoint;
  __shared_ptr<m2d::savanna::endpoint,(__gnu_cxx::_Lock_policy)2> local_1f0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e0 [4];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  request request;
  
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_char_(&)[5],_true>
            (local_1e0,(char (*) [5])"John",(char (*) [5])"1000");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[4],_const_char_(&)[5],_true>
            (local_1e0 + 1,(char (*) [4])"Tom",(char (*) [5])"1400");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_const_char_(&)[4],_true>
            (local_1e0 + 2,(char (*) [6])"Harry",(char (*) [4])"800");
  __l._M_len = 3;
  __l._M_array = local_1e0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&params,__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &request,(allocator_type *)&th);
  lVar4 = 0x80;
  do {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&local_1e0[0].first._M_dataplus._M_p + lVar4));
    lVar4 = lVar4 + -0x40;
  } while (lVar4 != -0x40);
  std::
  make_shared<get_yahoo_endpoint,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&>
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&endpoint);
  std::__shared_ptr<m2d::savanna::endpoint,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<get_yahoo_endpoint,void>
            (local_1f0,&endpoint.super___shared_ptr<get_yahoo_endpoint,_(__gnu_cxx::_Lock_policy)2>)
  ;
  m2d::savanna::ssl_reuse::request::request
            (&request,(shared_ptr<m2d::savanna::endpoint> *)local_1f0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1e8);
  std::__cxx11::string::assign((char *)&request.body);
  request.follow_location = true;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
            (local_1e0,(char (*) [2])"A",(char (*) [2])0x1af580);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
            (local_1e0 + 1,(char (*) [2])0x1af726,(char (*) [2])0x1af6e6);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
            (local_1e0 + 2,(char (*) [2])0x1ae1f2,(char (*) [2])0x1adcb0);
  async_session.
  super___shared_ptr<m2d::savanna::ssl_reuse::reuse_async_url_session,_(__gnu_cxx::_Lock_policy)2> =
       (__shared_ptr<m2d::savanna::ssl_reuse::reuse_async_url_session,_(__gnu_cxx::_Lock_policy)2>)
       boost::beast::http::detail::to_string(content_type);
  boost::basic_string_view::operator_cast_to_string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&th,
             (basic_string_view *)&async_session);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_(&)[11],_true>
            (local_1e0 + 3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&th,
             (char (*) [11])"text/plain");
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_assign_unique<std::pair<std::__cxx11::string_const,std::__cxx11::string>const*>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&request.header_fields,local_1e0,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&params);
  lVar4 = 0xc0;
  do {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&local_1e0[0].first._M_dataplus._M_p + lVar4));
    lVar4 = lVar4 + -0x40;
  } while (lVar4 != -0x40);
  std::__cxx11::string::~string((string *)&th);
  std::make_shared<m2d::savanna::ssl_reuse::reuse_async_url_session>();
  poVar1 = std::operator<<((ostream *)&std::cout,"Wait...");
  std::endl<char,std::char_traits<char>>(poVar1);
  th.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  th.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  th.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar6 = 3;
  __args = extraout_RDX;
  while( true ) {
    __last = th.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_finish;
    bVar7 = iVar6 == 0;
    iVar6 = iVar6 + -1;
    ptVar5 = th.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (bVar7) break;
    local_1e0[0].first._M_dataplus._M_p = (pointer)&async_session;
    local_1e0[0].first._M_string_length = (size_type)&request;
    if (th.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        th.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      __n = std::vector<std::thread,_std::allocator<std::thread>_>::_M_check_len
                      (&th,1,"vector::_M_realloc_insert");
      __last_00 = th.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      ptVar5 = th.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_start;
      __result = std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_allocate
                           (&th.super__Vector_base<std::thread,_std::allocator<std::thread>_>,__n);
      std::allocator_traits<std::allocator<std::thread>>::construct<std::thread,main::__0>
                ((allocator_type *)(((long)__last - (long)ptVar5) + (long)__result),
                 (thread *)local_1e0,__args_00);
      ptVar2 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                         (ptVar5,__last,__result,(allocator<std::thread> *)&th);
      ptVar2 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                         (__last,__last_00,ptVar2 + 1,(allocator<std::thread> *)&th);
      if (ptVar5 != (pointer)0x0) {
        operator_delete(ptVar5);
      }
      th.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = __result + __n;
      th.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start = __result;
      th.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish = ptVar2;
    }
    else {
      std::allocator_traits<std::allocator<std::thread>>::construct<std::thread,main::__0>
                ((allocator_type *)
                 th.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_finish,(thread *)local_1e0,__args);
      th.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish =
           th.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_1e0[0].first._M_dataplus._M_p = (pointer)0xc8;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)local_1e0);
    __args = extraout_RDX_00;
  }
  for (; ptVar5 != __last; ptVar5 = ptVar5 + 1) {
    std::thread::join();
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"Finish");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ssl_session_st>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ssl_session_st>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ssl_session_st>_>_>_>
  ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ssl_session_st>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ssl_session_st>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ssl_session_st>_>_>_>
              *)local_1e0,
             &((async_session.
                super___shared_ptr<m2d::savanna::ssl_reuse::reuse_async_url_session,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->ssl_cache_)._M_t);
  for (; (size_type *)local_1e0[0].first.field_2._8_8_ != &local_1e0[0].first._M_string_length;
      local_1e0[0].first.field_2._8_8_ =
           std::_Rb_tree_increment((_Rb_tree_node_base *)local_1e0[0].first.field_2._8_8_)) {
    poVar1 = std::operator<<((ostream *)&std::cout,"host: ");
    poVar1 = std::operator<<(poVar1,(string *)(local_1e0[0].first.field_2._8_8_ + 0x20));
    poVar1 = std::operator<<(poVar1,", session_ptr: ");
    pbVar3 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar1,
                             (__shared_ptr<ssl_session_st,_(__gnu_cxx::_Lock_policy)2> *)
                             (local_1e0[0].first.field_2._8_8_ + 0x40));
    std::endl<char,std::char_traits<char>>((ostream *)pbVar3);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ssl_session_st>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ssl_session_st>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ssl_session_st>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ssl_session_st>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ssl_session_st>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ssl_session_st>_>_>_>
               *)local_1e0);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&th);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&async_session.
              super___shared_ptr<m2d::savanna::ssl_reuse::reuse_async_url_session,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  m2d::savanna::ssl_reuse::request::~request(&request);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&endpoint.super___shared_ptr<get_yahoo_endpoint,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&params._M_t);
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
	std::map<std::string, std::string> params {
		{ "John", "1000" },
		{ "Tom", "1400" },
		{ "Harry", "800" }
	};
	auto endpoint = std::make_shared<get_yahoo_endpoint>(params);
	savanna::ssl_reuse::request request(endpoint);
	//    auto endpoint = post_localhost_endpoint(params);
	//    savanna::request<post_localhost_endpoint> request(std::move(endpoint));
	request.body = "BODY";
	request.follow_location = true;

	// see also
	// https://www.boost.org/doc/libs/1_72_0/boost/beast/http/field.hpp
	request.header_fields = {
		{ "A", "a" },
		{ "B", "b" },
		{ "C", "c" },
		{ savanna::to_string(http::field::content_type), "text/plain" }
	};

	auto async_session = std::make_shared<savanna::ssl_reuse::reuse_async_url_session>();
	std::cout << "Wait..." << std::endl;

	std::vector<std::thread> th;
	for(int i=0; i<3; i++){
		th.emplace_back([&] {
			ssl::context ssl_ctx(ssl::context::tlsv12_client);
			std::once_flag once;
			std::call_once(once, savanna::load_root_cert, m2d::root_cert(), ssl_ctx);
			auto executor = async_session->prepare<http::dynamic_body>(std::move(ssl_ctx));
			executor->send(request, [&](savanna::result<http::response<http::dynamic_body>> result) {
				if (result.error) {
					auto e = *(result.error);
					std::cout << "Error: " << e.what() << ", code: " << e.code() << std::endl;
					return;
				}

				auto response = *(result.response);
				//		std::cout << "Got response: " << response << std::endl;
				std::cout << "Got response" << std::endl;
			});
			std::cout << "Done" << std::endl << std::endl;
		});
		std::this_thread::sleep_for(std::chrono::milliseconds(200));
	}
	for(auto &t : th){
		t.join();
	}
	std::cout << "Finish" << std::endl;
	for(const auto &item : async_session->ssl_cache()){
		std::cout << "host: " << item.first << ", session_ptr: " << item.second << std::endl;
	}
	return 0;
}